

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::run(LegalizeJSInterface *this,Module *module)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  pointer puVar1;
  uintptr_t uVar2;
  pointer puVar3;
  _Variadic_union<wasm::Name,_wasm::HeapType> *p_Var4;
  pointer puVar5;
  Global *pGVar6;
  undefined8 *puVar7;
  pointer puVar8;
  DataSegment *pDVar9;
  string_view target;
  Name name;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar11;
  pointer pTVar12;
  pointer puVar13;
  pointer ppFVar14;
  LegalizeJSInterface *pLVar15;
  bool bVar16;
  bool bVar17;
  Index IVar18;
  Function *pFVar19;
  Function *pFVar20;
  Type *pTVar21;
  Expression *pEVar22;
  LocalGet *pLVar23;
  LocalSet *item;
  Export *pEVar24;
  Function *pFVar25;
  Call *pCVar26;
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  *this_01;
  Call *pCVar27;
  mapped_type *ppFVar28;
  pointer puVar29;
  variant<wasm::Name,_wasm::HeapType> *pvVar30;
  Type TVar31;
  char *pcVar32;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  undefined1 auVar33 [8];
  ExpressionList *this_02;
  __node_base *p_Var34;
  size_t sVar35;
  char *pcVar36;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var37;
  Type in_R8;
  Type in_R9;
  undefined8 *puVar38;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar39;
  pointer puVar40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  HeapType *pHVar41;
  pointer puVar42;
  _Head_base<0UL,_wasm::Function_*,_false> _Var43;
  Signature SVar44;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar45;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar46;
  Signature sig;
  Name name_00;
  Name name_01;
  initializer_list<wasm::Expression_*> __l;
  optional<wasm::Type> type_;
  Name name_02;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  Name name_07;
  undefined1 auStack_278 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> legalParams;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [3];
  bool local_228;
  Walker<Fixer,_wasm::Visitor<Fixer,_void>_> local_220;
  unordered_map<wasm::Name,_wasm::Function_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  *local_148;
  HeapType *local_140;
  undefined1 auStack_138 [8];
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  newExports;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_110;
  undefined1 auStack_108 [8];
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> originalFunctions;
  undefined1 local_e0 [8];
  Builder builder;
  Type *local_c0;
  _Variadic_union<wasm::Name,_wasm::HeapType> local_a8;
  undefined1 auStack_98 [8];
  Iterator __begin2;
  allocator<char> local_71;
  _Variadic_union<wasm::Name,_wasm::HeapType> *local_70;
  LegalizeJSInterface *local_68;
  _Head_base<0UL,_wasm::Function_*,_false> local_60;
  __single_object stub;
  Type local_48;
  Builder builder_1;
  __single_object legalIm;
  
  this->getTempRet0 = (Function *)0x0;
  this->setTempRet0 = (Function *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_278,"legalize-js-interface-export-originals",
             (allocator<char> *)auStack_98);
  bVar16 = Pass::hasArgument(&this->super_Pass,(string *)auStack_278);
  std::__cxx11::string::~string((string *)auStack_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_278,"legalize-js-interface-exported-helpers",
             (allocator<char> *)auStack_98);
  pcVar36 = auStack_278;
  bVar17 = Pass::hasArgument(&this->super_Pass,(string *)pcVar36);
  this->exportedHelpers = bVar17;
  std::__cxx11::string::~string((string *)auStack_278);
  auStack_138 = (undefined1  [8])0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar29 = (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&module->allocator;
  local_68 = this;
  while( true ) {
    puVar13 = newExports.
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar33 = auStack_138;
    if (puVar29 == puVar1) break;
    pEVar24 = (puVar29->_M_t).
              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar24->kind == Function) {
      originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pEVar24->value;
      if (*(__index_type *)
           ((long)&(pEVar24->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) != '\0')
      {
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      pcVar36 = *(char **)&(((variant<wasm::Name,_wasm::HeapType> *)
                            originalFunctions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Variant_base<wasm::Name,_wasm::HeapType>).
                           super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>;
      pFVar19 = Module::getFunction(module,(IString)*(IString *)
                                                     &(((variant<wasm::Name,_wasm::HeapType> *)
                                                       originalFunctions.
                                                                                                              
                                                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->super__Variant_base<wasm::Name,_wasm::HeapType>
                                                  ).
                                                  super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                  .
                                                  super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                                   );
      bVar17 = isIllegal<wasm::Function>((LegalizeJSInterface *)pFVar19,(Function *)pcVar36);
      if (bVar17) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_98,"legalstub$",(allocator<char> *)&local_a8._M_first);
        IString::toString_abi_cxx11_((string *)local_e0,(IString *)pFVar19);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_278,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_98,(string *)local_e0);
        IString::IString((IString *)auStack_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_278);
        std::__cxx11::string::~string((string *)auStack_278);
        std::__cxx11::string::~string((string *)local_e0);
        std::__cxx11::string::~string((string *)auStack_98);
        name.super_IString.str._M_str =
             (char *)originalFunctions.
                     super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
        name.super_IString.str._M_len = (size_t)auStack_108;
        pcVar36 = (char *)auStack_108;
        pFVar20 = Module::getFunctionOrNull(module,name);
        auVar33 = auStack_108;
        pFVar25 = (Function *)
                  originalFunctions.
                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pFVar20 == (Function *)0x0) {
          local_e0 = (undefined1  [8])module;
          pcVar36 = (char *)operator_new(0x1d8);
          memset(pcVar36,0,0x1d8);
          Function::Function((Function *)pcVar36);
          (((Importable *)&((_Uninitialized<wasm::Name,_true> *)pcVar36)->_M_storage)->super_Named).
          name.super_IString.str._M_len = (size_t)auStack_108;
          (((Importable *)&((_Uninitialized<wasm::Name,_true> *)pcVar36)->_M_storage)->super_Named).
          name.super_IString.str._M_str =
               (char *)originalFunctions.
                       super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          *(bool *)((long)pcVar36 + 0x10) = true;
          local_110._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
               (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
               MixedArena::alloc<wasm::Call>
                         ((MixedArena *)
                          newExports.
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar32 = (pFVar19->super_Importable).super_Named.name.super_IString.str._M_str;
          (((Name *)((long)local_110._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x30))->
          super_IString).str._M_len =
               (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
          *(char **)((long)local_110._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38) =
               pcVar32;
          pHVar41 = &pFVar19->type;
          SVar44 = HeapType::getSignature(pHVar41);
          ((Type *)((long)local_110._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8))->id =
               SVar44.results.id.id;
          auStack_278 = (undefined1  [8])0x0;
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_140 = pHVar41;
          SVar44 = HeapType::getSignature(pHVar41);
          local_a8._M_first._M_storage.super_IString.str._M_len = (size_t)SVar44.params.id;
          auStack_98 = (undefined1  [8])&local_a8;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)0x0;
          PVar45 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                   wasm::Type::end((Type *)auStack_98);
          while( true ) {
            pHVar41 = local_140;
            PVar10.index = (size_t)__begin2.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent;
            PVar10.parent = (Type *)auStack_98;
            stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
                 (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
                 PVar45.index;
            local_70 = (_Variadic_union<wasm::Name,_wasm::HeapType> *)PVar45.parent;
            if (PVar45 == PVar10) break;
            pTVar21 = wasm::Type::Iterator::operator*((Iterator *)auStack_98);
            pTVar12 = legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            auVar33 = auStack_278;
            uVar2 = pTVar21->id;
            if (uVar2 == 3) {
              IVar18 = (Index)((ulong)((long)legalParams.
                                             super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      (long)auStack_278) >> 3);
              pEVar22 = I64Utilities::recreateI64((Builder *)local_e0,IVar18,IVar18 + 1);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         ((long)local_110._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10)
                         ,pEVar22);
              local_48.id = 2;
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_278,&local_48);
              local_48.id = 2;
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_278,&local_48);
            }
            else {
              pLVar23 = MixedArena::alloc<wasm::LocalGet>((MixedArena *)((long)local_e0 + 0x200));
              pLVar23->index = (Index)((ulong)((long)pTVar12 - (long)auVar33) >> 3);
              (pLVar23->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id
                   = uVar2;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                         ((long)local_110._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10)
                         ,(Expression *)pLVar23);
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_278,pTVar21);
            }
            PVar45.index = (size_t)stub._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            PVar45.parent = (Type *)local_70;
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)((long)&(__begin2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
          }
          SVar44 = HeapType::getSignature(local_140);
          TVar31.id = 2;
          if (SVar44.results.id.id != 3) {
            SVar44 = HeapType::getSignature(pHVar41);
            TVar31 = SVar44.results.id;
          }
          wasm::Type::Type((Type *)&local_a8._M_first,(Tuple *)auStack_278);
          sig.results.id = TVar31.id;
          sig.params.id = local_a8._M_first._M_storage.super_IString.str._M_len;
          HeapType::HeapType((HeapType *)auStack_98,sig);
          ((HeapType *)((long)pcVar36 + 0x38))->id = (uintptr_t)auStack_98;
          SVar44 = HeapType::getSignature(pHVar41);
          if (SVar44.results.id.id == 3) {
            IVar18 = Builder::addVar((Builder *)pcVar36,(Function *)0x0,(Name)(ZEXT816(3) << 0x40),
                                     in_R8);
            stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
                 (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
                 MixedArena::alloc<wasm::Block>((MixedArena *)((long)local_e0 + 0x200));
            item = Builder::makeLocalSet
                             ((Builder *)local_e0,IVar18,
                              (Expression *)
                              local_110._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
            this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                      ((long)stub._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (this_00,(Expression *)item);
            pFVar25 = local_68->setTempRet0;
            if (pFVar25 == (Function *)0x0) {
              if (local_68->exportedHelpers == true) {
                name_00.super_IString.str._M_str = DAT_01175b38;
                name_00.super_IString.str._M_len = wasm::(anonymous_namespace)::SET_TEMP_RET_EXPORT;
                pEVar24 = Module::getExport(module,name_00);
                pcVar32 = (char *)0x0;
                sVar35 = 0;
                if (pEVar24->kind == Function) {
                  pvVar30 = &pEVar24->value;
                  if (*(__index_type *)
                       ((long)&(pEVar24->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) !=
                      '\0') {
                    pvVar30 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
                  }
                  sVar35 = *(size_t *)
                            &(pvVar30->super__Variant_base<wasm::Name,_wasm::HeapType>).
                             super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                             super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                             super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                             super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                             super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
                  pcVar32 = *(char **)((long)&(pvVar30->
                                              super__Variant_base<wasm::Name,_wasm::HeapType>).
                                              super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                              super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                              super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                              super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                              super__Variant_storage_alias<wasm::Name,_wasm::HeapType>
                                              ._M_u + 8);
                }
                name_01.super_IString.str._M_str = pcVar32;
                name_01.super_IString.str._M_len = sVar35;
                pFVar25 = Module::getFunction(module,name_01);
              }
              else {
                name_06.super_IString.str._M_str = (char *)0x2;
                name_06.super_IString.str._M_len = DAT_01175b58;
                pFVar25 = getFunctionOrImport((LegalizeJSInterface *)module,
                                              wasm::(anonymous_namespace)::SET_TEMP_RET_IMPORT,
                                              name_06,(Type)0x0,in_R9);
              }
              local_68->setTempRet0 = pFVar25;
            }
            target = (pFVar25->super_Importable).super_Named.name.super_IString.str;
            local_48.id = (uintptr_t)I64Utilities::getI64High((Builder *)local_e0,IVar18);
            __l._M_len = 1;
            __l._M_array = (iterator)&local_48;
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_98
                       ,__l,(allocator_type *)&builder_1);
            in_R8.id = 0;
            in_R9.id = 0;
            pCVar26 = Builder::makeCall((Builder *)local_e0,(Name)target,
                                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                         *)auStack_98,(Type)0x0,false);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (this_00,(Expression *)pCVar26);
            std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
            ~_Vector_base((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                          auStack_98);
            pEVar22 = I64Utilities::getI64Low((Builder *)local_e0,IVar18);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (this_00,pEVar22);
            local_110._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
                 (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
                 (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)stub;
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)pEVar22;
            Block::finalize((Block *)stub._M_t.
                                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                            type_,Unknown);
          }
          (((_Variadic_union<wasm::Name,_wasm::HeapType> *)((long)pcVar36 + 0x60))->_M_first).
          _M_storage.super_IString.str._M_len =
               (size_t)local_110._M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
          pFVar25 = Module::addFunction(module,(Function *)pcVar36);
          auVar33 = (undefined1  [8])
                    (pFVar25->super_Importable).super_Named.name.super_IString.str._M_len;
          pFVar25 = (Function *)
                    (pFVar25->super_Importable).super_Named.name.super_IString.str._M_str;
          std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                    ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_278);
        }
        *originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage = (Function *)auVar33;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[1] = pFVar25;
        if ((bVar16) && ((pFVar19->super_Importable).module.super_IString.str._M_str == (char *)0x0)
           ) {
          pEVar24 = (puVar29->_M_t).
                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          auStack_278 = *(undefined1 (*) [8])&(pEVar24->name).super_IString;
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)((long)&(pEVar24->name).super_IString + 8);
          pcVar36 = "dynCall_";
          bVar17 = IString::startsWith<9>((IString *)auStack_278,(char (*) [9])"dynCall_");
          if (!bVar17) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)auStack_98,"orig$",(allocator<char> *)&local_a8._M_first);
            IString::toString_abi_cxx11_
                      ((string *)
                       &((_Variadic_union<wasm::Name,_wasm::HeapType> *)local_e0)->_M_first,
                       (IString *)
                       (puVar29->_M_t).
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                       super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &((_Variadic_union<wasm::Name,_wasm::HeapType> *)local_e0)->_M_first);
            IString::IString((IString *)auStack_108,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             auStack_278);
            std::__cxx11::string::~string((string *)auStack_278);
            std::__cxx11::string::~string
                      ((string *)
                       &((_Variadic_union<wasm::Name,_wasm::HeapType> *)local_e0)->_M_first);
            std::__cxx11::string::~string((string *)auStack_98);
            auStack_278 = (undefined1  [8])
                          (pFVar19->super_Importable).super_Named.name.super_IString.str._M_len;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(pFVar19->super_Importable).super_Named.name.super_IString.str._M_str;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)((ulong)legalParams.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
            auStack_98 = auStack_108;
            __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)originalFunctions.
                         super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
            local_a8._M_first._M_storage.super_IString.str._M_len =
                 local_a8._M_first._M_storage.super_IString.str._M_len & 0xffffffff00000000;
            std::
            make_unique<wasm::Export,wasm::Name&,wasm::ExternalKind&,std::variant<wasm::Name,wasm::HeapType>&>
                      (&(((_Variadic_union<wasm::Name,_wasm::HeapType> *)local_e0)->_M_first).
                        _M_storage,(ExternalKind *)auStack_98,
                       (variant<wasm::Name,_wasm::HeapType> *)&local_a8._M_first);
            pcVar36 = (char *)local_e0;
            std::
            vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>
            ::emplace_back<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>
                      ((vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>
                        *)auStack_138,
                       (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                       &((_Variadic_union<wasm::Name,_wasm::HeapType> *)local_e0)->_M_first);
            std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr
                      ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                       &((_Variadic_union<wasm::Name,_wasm::HeapType> *)local_e0)->_M_first);
          }
        }
      }
    }
    puVar29 = puVar29 + 1;
  }
  for (; auVar33 != (undefined1  [8])puVar13;
      auVar33 = (undefined1  [8])
                &(((Importable *)&((_Uninitialized<wasm::Name,_true> *)auVar33)->_M_storage)->
                 super_Named).name.super_IString.str._M_str) {
    pcVar36 = (char *)auVar33;
    Module::addExport(module,(unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auVar33
                     );
  }
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  puVar3 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar42 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar14 = originalFunctions.
                 super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                 super__Vector_impl_data._M_start, puVar42 != puVar3; puVar42 = puVar42 + 1) {
    auStack_278 = (undefined1  [8])
                  (puVar42->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pcVar36 = (char *)auStack_278;
    std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
              ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)auStack_108,
               (Function **)&((_Variadic_union<wasm::Name,_wasm::HeapType> *)auStack_278)->_M_rest);
  }
  this_01 = &local_68->illegalImportsToLegal;
  for (auVar33 = auStack_108; pLVar15 = local_68, auVar33 != (undefined1  [8])ppFVar14;
      auVar33 = (undefined1  [8])((long)auVar33 + 8)) {
    p_Var4 = *(_Variadic_union<wasm::Name,_wasm::HeapType> **)auVar33;
    if (((&p_Var4->_M_rest)[4] != (_Variadic_union<wasm::HeapType>)0x0) &&
       (local_70 = p_Var4,
       bVar16 = isIllegal<wasm::Function>
                          ((LegalizeJSInterface *)&p_Var4->_M_first,(Function *)pcVar36), bVar16)) {
      local_48.id = (uintptr_t)module;
      std::make_unique<wasm::Function>();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_98,"legalimport$",(allocator<char> *)&local_60);
      IString::toString_abi_cxx11_((string *)local_e0,(IString *)&local_70->_M_first);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_98
                     ,(string *)local_e0);
      IString::IString((IString *)&local_a8._M_first,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_278);
      ((builder_1.wasm)->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_a8._M_first._M_storage.super_IString.str._M_len;
      ((builder_1.wasm)->exports).
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_a8._M_first._M_storage.super_IString.str._M_str;
      std::__cxx11::string::~string((string *)auStack_278);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)auStack_98);
      puVar42 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&local_70->_M_first + 2))->_M_allocated_capacity;
      ((builder_1.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((string *)(&local_70->_M_first + 1))->_M_string_length;
      ((builder_1.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar42;
      puVar39 = *(pointer *)
                 &(((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(&local_70->_M_first + 3))->
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus;
      ((builder_1.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((long)(&local_70->_M_first + 2) + 8);
      ((builder_1.wasm)->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar39;
      *(undefined1 *)
       &((builder_1.wasm)->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
      std::make_unique<wasm::Function>();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_98,"legalfunc$",&local_71);
      IString::toString_abi_cxx11_((string *)local_e0,(IString *)&local_70->_M_first);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_98
                     ,(string *)local_e0);
      IString::IString((IString *)&local_a8._M_first,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_278);
      ((local_60._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
           local_a8._M_first._M_storage.super_IString.str._M_len;
      ((local_60._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
           local_a8._M_first._M_storage.super_IString.str._M_str;
      std::__cxx11::string::~string((string *)auStack_278);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)auStack_98);
      p_Var4 = local_70;
      ((local_60._M_head_impl)->type).id = *(uintptr_t *)((long)local_70 + 0x38);
      ((local_60._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
      pCVar26 = MixedArena::alloc<wasm::Call>
                          ((MixedArena *)
                           newExports.
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)p_Var4 + 0x38);
      puVar29 = ((builder_1.wasm)->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (pCVar26->target).super_IString.str._M_len =
           (size_t)((builder_1.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      (pCVar26->target).super_IString.str._M_str = (char *)puVar29;
      auStack_278 = (undefined1  [8])0x0;
      legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      SVar44 = HeapType::getSignature
                         ((HeapType *)
                          originalFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_e0 = (undefined1  [8])SVar44.params.id;
      auStack_98 = (undefined1  [8])local_e0;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      PVar46 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)auStack_98);
      this_02 = &pCVar26->operands;
      IVar18 = 0;
      while( true ) {
        PVar11.index = (size_t)__begin2.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent;
        PVar11.parent = (Type *)auStack_98;
        stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
             PVar46.index;
        local_c0 = PVar46.parent;
        if (PVar46 == PVar11) break;
        pTVar21 = wasm::Type::Iterator::operator*((Iterator *)auStack_98);
        uVar2 = pTVar21->id;
        if (uVar2 == 3) {
          pEVar22 = I64Utilities::getI64Low((Builder *)&local_48,IVar18);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&this_02->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar22);
          pEVar22 = I64Utilities::getI64High((Builder *)&local_48,IVar18);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&this_02->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar22);
          local_a8._M_first._M_storage.super_IString.str._M_len = 2;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_278,
                     (Type *)&local_a8._M_first);
          local_a8._M_first._M_storage.super_IString.str._M_len = 2;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_278,
                     (Type *)&local_a8._M_first);
        }
        else {
          pLVar23 = MixedArena::alloc<wasm::LocalGet>((MixedArena *)(local_48.id + 0x200));
          pLVar23->index = IVar18;
          (pLVar23->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
               uVar2;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&this_02->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     (Expression *)pLVar23);
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_278,pTVar21);
        }
        PVar46.index = (size_t)stub._M_t.
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        PVar46.parent = local_c0;
        IVar18 = IVar18 + 1;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      }
      SVar44 = HeapType::getSignature
                         ((HeapType *)
                          originalFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (SVar44.results.id.id == 3) {
        (pCVar26->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id = 2;
        pFVar19 = this->getTempRet0;
        TVar31.id = 2;
        if (pFVar19 == (Function *)0x0) {
          if (local_68->exportedHelpers == true) {
            name_02.super_IString.str._M_str = DAT_01175b28;
            name_02.super_IString.str._M_len = wasm::(anonymous_namespace)::GET_TEMP_RET_EXPORT;
            pEVar24 = Module::getExport(module,name_02);
            pcVar36 = (char *)0x0;
            sVar35 = 0;
            if (pEVar24->kind == Function) {
              pvVar30 = &pEVar24->value;
              if (*(__index_type *)
                   ((long)&(pEVar24->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                           super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                           super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                           super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) != '\0')
              {
                pvVar30 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
              }
              sVar35 = *(size_t *)
                        &(pvVar30->super__Variant_base<wasm::Name,_wasm::HeapType>).
                         super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                         super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                         super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                         super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
              pcVar36 = *(char **)((long)&(pvVar30->super__Variant_base<wasm::Name,_wasm::HeapType>)
                                          .super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>.
                                          _M_u + 8);
            }
            name_03.super_IString.str._M_str = pcVar36;
            name_03.super_IString.str._M_len = sVar35;
            pFVar19 = Module::getFunction(module,name_03);
          }
          else {
            name_07.super_IString.str._M_str = (char *)0x0;
            name_07.super_IString.str._M_len = DAT_01175b48;
            pFVar19 = getFunctionOrImport((LegalizeJSInterface *)module,
                                          wasm::(anonymous_namespace)::GET_TEMP_RET_IMPORT,name_07,
                                          (Type)0x2,in_R9);
          }
          this->getTempRet0 = pFVar19;
          TVar31.id = (pCVar26->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.
                      type.id;
        }
        auStack_98 = (undefined1  [8])0x0;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)0x0;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
        in_R9.id = 0;
        pCVar27 = Builder::makeCall((Builder *)&local_48,
                                    (Name)(pFVar19->super_Importable).super_Named.name.super_IString
                                          .str,
                                    (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)auStack_98,TVar31,false);
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   auStack_98);
        pCVar27 = (Call *)I64Utilities::recreateI64
                                    ((Builder *)&local_48,(Expression *)pCVar26,
                                     (Expression *)pCVar27);
      }
      else {
        SVar44 = HeapType::getSignature
                           ((HeapType *)
                            originalFunctions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        (pCVar26->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id =
             SVar44.results.id.id;
        pCVar27 = pCVar26;
      }
      (local_60._M_head_impl)->body = (Expression *)pCVar27;
      wasm::Type::Type((Type *)local_e0,(Tuple *)auStack_278);
      SVar44.results.id =
           (pCVar26->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id;
      SVar44.params.id = (uintptr_t)local_e0;
      HeapType::HeapType((HeapType *)auStack_98,SVar44);
      _Var43._M_head_impl = local_60._M_head_impl;
      ((builder_1.wasm)->globals).
      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_98;
      pFVar19 = Module::getFunctionOrNull
                          (module,(Name)((local_60._M_head_impl)->super_Importable).super_Named.name
                                        .super_IString.str);
      if (pFVar19 == (Function *)0x0) {
        Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                    *)&local_60);
      }
      pFVar19 = Module::getFunctionOrNull
                          (module,(IString)*(IString *)
                                            &((builder_1.wasm)->exports).
                                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                             ._M_impl.super__Vector_impl_data);
      if (pFVar19 == (Function *)0x0) {
        Module::addFunction(module,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                    *)&builder_1);
      }
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_278);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_60);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&builder_1);
      pcVar36 = (char *)local_70;
      ppFVar28 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_01,&(local_70->_M_first)._M_storage);
      *ppFVar28 = _Var43._M_head_impl;
    }
  }
  if ((local_68->illegalImportsToLegal)._M_h._M_element_count != 0) {
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_258;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_258[0]._M_local_buf[0] = '\0';
    local_228 = false;
    local_220.replacep = (Expression **)0x0;
    local_220.stack.usedFixed = 0;
    local_220.stack.flexible.
    super__Vector_base<wasm::Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_220.stack.flexible.
    super__Vector_base<wasm::Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_220.stack.flexible.
    super__Vector_base<wasm::Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::Task,_std::allocator<wasm::Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_220.currFunction = (Function *)0x0;
    local_220.currModule = (Module *)0x0;
    auStack_278 = (undefined1  [8])&PTR__WalkerPass_01122150;
    local_148 = this_01;
    Pass::setPassRunner((Pass *)auStack_278,(local_68->super_Pass).runner);
    (**(code **)((long)auStack_278 + 0x10))((Pass *)auStack_278,module);
    Pass::setPassRunner((Pass *)auStack_278,(pLVar15->super_Pass).runner);
    puVar5 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_220.currModule = module;
    for (puVar39 = (module->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar39 != puVar5;
        puVar39 = puVar39 + 1) {
      pGVar6 = (puVar39->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar6->super_Importable).module + 8) == (char *)0x0) {
        Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk(&local_220,&pGVar6->init);
      }
    }
    stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (module->elementSegments).
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    for (_Var43._M_head_impl =
              (Function *)
              (module->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
        _Var43._M_head_impl !=
        (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
        stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        _Var43._M_head_impl =
             (Function *)
             ((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
               *)&(_Var43._M_head_impl)->super_Importable + 1)) {
      _Var37._M_head_impl =
           *(ElementSegment **)
            &(((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                *)&(_Var43._M_head_impl)->super_Importable)->
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             )._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
      ;
      if ((_Var37._M_head_impl)->offset != (Expression *)0x0) {
        Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk(&local_220,&(_Var37._M_head_impl)->offset);
        _Var37._M_head_impl =
             *(ElementSegment **)
              &(((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                  *)&(_Var43._M_head_impl)->super_Importable)->
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
               )._M_t.
               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
        ;
      }
      puVar7 = *(undefined8 **)((long)_Var37._M_head_impl + 0x40);
      for (puVar38 = *(undefined8 **)((long)_Var37._M_head_impl + 0x38); puVar38 != puVar7;
          puVar38 = puVar38 + 1) {
        auStack_98 = (undefined1  [8])*puVar38;
        Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk(&local_220,(Expression **)auStack_98);
      }
    }
    puVar8 = (module->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar40 = (module->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar40 != puVar8;
        puVar40 = puVar40 + 1) {
      pDVar9 = (puVar40->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar9->offset != (Expression *)0x0) {
        Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk(&local_220,&pDVar9->offset);
      }
    }
    local_220.currModule = (Module *)0x0;
    p_Var34 = &(local_68->illegalImportsToLegal)._M_h._M_before_begin;
    while (p_Var34 = p_Var34->_M_nxt, p_Var34 != (__node_base *)0x0) {
      Module::removeFunction(module,(Name)*(string_view *)(p_Var34 + 1));
    }
    WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_>::~WalkerPass
              ((WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_> *)auStack_278);
  }
  name_04.super_IString.str._M_str = DAT_01175b28;
  name_04.super_IString.str._M_len = wasm::(anonymous_namespace)::GET_TEMP_RET_EXPORT;
  Module::removeExport(module,name_04);
  name_05.super_IString.str._M_str = DAT_01175b38;
  name_05.super_IString.str._M_len = wasm::(anonymous_namespace)::SET_TEMP_RET_EXPORT;
  Module::removeExport(module,name_05);
  std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
            ((_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)auStack_108);
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::~vector((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             *)auStack_138);
  return;
}

Assistant:

void run(Module* module) override {
    setTempRet0 = nullptr;
    getTempRet0 = nullptr;
    auto exportOriginals =
      hasArgument("legalize-js-interface-export-originals");
    exportedHelpers = hasArgument("legalize-js-interface-exported-helpers");
    // for each illegal export, we must export a legalized stub instead
    std::vector<std::unique_ptr<Export>> newExports;
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function) {
        // if it's an import, ignore it
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        if (isIllegal(func)) {
          // Provide a legal function for the export.
          auto legalName = makeLegalStub(func, module);
          *name = legalName;
          if (exportOriginals) {
            // Also export the original function, before legalization. This is
            // not normally useful for JS, except in cases like dynamic linking
            // where the JS loader code must copy exported wasm functions into
            // the table, and they must not be legalized as other wasm code will
            // do an indirect call to them. However, don't do this for imported
            // functions, as those would be legalized in their actual module
            // anyhow. It also makes no sense to do this for dynCalls, as they
            // are only called from JS.
            if (!func->imported() && !isDynCall(ex->name)) {
              Builder builder(*module);
              Name newName = std::string("orig$") + ex->name.toString();
              newExports.push_back(builder.makeExport(
                newName, func->name, ExternalKind::Function));
            }
          }
        }
      }
    }

    for (auto& ex : newExports) {
      module->addExport(std::move(ex));
    }
    // Avoid iterator invalidation later.
    std::vector<Function*> originalFunctions;
    for (auto& func : module->functions) {
      originalFunctions.push_back(func.get());
    }
    // for each illegal import, we must call a legalized stub instead
    for (auto* im : originalFunctions) {
      if (im->imported() && isIllegal(im)) {
        auto* func = makeLegalStubForCalledImport(im, module);
        illegalImportsToLegal[im->name] = func;
      }
    }

    if (!illegalImportsToLegal.empty()) {
      // fix up imports: call of an illegal import must be turned to a call of a
      // legal import. the same must be done with ref.funcs.
      struct Fixer : public WalkerPass<PostWalker<Fixer>> {
        bool isFunctionParallel() override { return true; }

        std::unique_ptr<Pass> create() override {
          return std::make_unique<Fixer>(illegalImportsToLegal);
        }

        std::unordered_map<Name, Function*>& illegalImportsToLegal;

        Fixer(std::unordered_map<Name, Function*>& illegalImportsToLegal)
          : illegalImportsToLegal(illegalImportsToLegal) {}

        void visitCall(Call* curr) {
          auto iter = illegalImportsToLegal.find(curr->target);
          if (iter == illegalImportsToLegal.end()) {
            return;
          }

          replaceCurrent(Builder(*getModule())
                           .makeCall(iter->second->name,
                                     curr->operands,
                                     curr->type,
                                     curr->isReturn));
        }

        void visitRefFunc(RefFunc* curr) {
          auto iter = illegalImportsToLegal.find(curr->func);
          if (iter == illegalImportsToLegal.end()) {
            return;
          }

          curr->func = iter->second->name;
          // TODO: Make this exact.
          curr->type = Type(iter->second->type, NonNullable);
        }
      };

      Fixer fixer(illegalImportsToLegal);
      fixer.run(getPassRunner(), module);
      fixer.runOnModuleCode(getPassRunner(), module);

      // Finally we can remove all the now-unused illegal imports
      for (const auto& pair : illegalImportsToLegal) {
        module->removeFunction(pair.first);
      }
    }

    module->removeExport(GET_TEMP_RET_EXPORT);
    module->removeExport(SET_TEMP_RET_EXPORT);
  }